

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_NtkAddClauses(Ifn_Ntk_t *p,int *pValues,sat_solver *pSat)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Ifn_Obj_t *pIVar14;
  ulong uVar15;
  int *piVar16;
  long lVar17;
  uint uVar18;
  long lVar20;
  uint *end;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  int pLits [13];
  int pLits2 [13];
  uint local_d8 [14];
  uint *local_a0;
  long local_98;
  ulong local_90;
  uint local_88 [16];
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  ulong uVar19;
  
  iVar5 = sat_solver_nvars(pSat);
  iVar11 = p->nObjs;
  if (0 < (long)iVar11) {
    iVar8 = iVar5 << 0x10;
    iVar5 = iVar5 + iVar11;
    lVar17 = 0;
    do {
      *(uint *)((long)p->Nodes[0].Fanins + lVar17 + -4) =
           (uint)*(ushort *)((long)p->Nodes[0].Fanins + lVar17 + -4) + iVar8;
      lVar17 = lVar17 + 0x30;
      iVar8 = iVar8 + 0x10000;
    } while ((long)iVar11 * 0x30 != lVar17);
  }
  sat_solver_setnvars(pSat,iVar5);
  uVar12 = p->nVars;
  lVar17 = (long)(int)uVar12;
  if (0 < lVar17) {
    lVar6 = 0;
    do {
      if (pValues[lVar6] == -1) {
        __assert_fail("pValues[i] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x462,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
      }
      lVar6 = lVar6 + 1;
    } while (lVar17 != lVar6);
  }
  iVar11 = p->nObjs;
  if ((int)uVar12 < iVar11 + -1) {
    lVar6 = 0;
    do {
      if (pValues[lVar17 + lVar6] != -1) {
        __assert_fail("pValues[i] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x464,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
      }
      lVar6 = lVar6 + 1;
    } while (~uVar12 + iVar11 != (int)lVar6);
  }
  if (pValues[(long)iVar11 + -1] == -1) {
    __assert_fail("pValues[p->nObjs-1] != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                  ,0x465,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
  }
  iVar5 = p->nInps;
  if (0 < iVar5) {
    lVar6 = 0;
    do {
      if (0 < (int)lVar17) {
        iVar11 = p->nParsVNum * (int)lVar6 + p->nParsVIni;
        lVar20 = 0;
        do {
          local_d8[0] = (uint)(pValues[lVar20] == 0) +
                        (uint)*(ushort *)&p->Nodes[lVar6].field_0x2 * 2;
          lVar17 = (long)p->nParsVNum;
          if (0 < lVar17) {
            lVar10 = 0;
            iVar5 = iVar11 * 2;
            do {
              if ((int)(iVar11 + (uint)lVar10) < 0) {
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              local_d8[lVar10 + 1] =
                   iVar5 + (uint)(((uint)lVar20 >> ((uint)lVar10 & 0x1f) & 1) != 0);
              lVar10 = lVar10 + 1;
              iVar5 = iVar5 + 2;
            } while (lVar17 != lVar10);
          }
          iVar5 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)(local_d8 + lVar17 + 1));
          if (iVar5 == 0) {
            return 0;
          }
          lVar20 = lVar20 + 1;
          lVar17 = (long)p->nVars;
        } while (lVar20 < lVar17);
        iVar5 = p->nInps;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar5);
    iVar11 = p->nObjs;
  }
  if (iVar5 < iVar11) {
    lVar17 = (long)iVar5;
    piVar16 = p->Nodes[lVar17].Fanins;
    do {
      end = local_d8 + 3;
      uVar12 = *(uint *)(p->Nodes + lVar17);
      if (3 < (uVar12 & 7) - 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                      ,0x4d7,"int Ifn_NtkAddClauses(Ifn_Ntk_t *, int *, sat_solver *)");
      }
      pIVar14 = p->Nodes + lVar17;
      uVar9 = uVar12 >> 3;
      uVar18 = uVar9 & 0x1f;
      uVar19 = (ulong)uVar18;
      local_98 = lVar17;
      local_90 = uVar19;
      switch(uVar12 & 7) {
      case 3:
        local_d8[0] = uVar12 >> 0xf & 0xfffffffe;
        if (uVar18 == 0) {
          uVar7 = 1;
        }
        else {
          uVar15 = 1;
          do {
            uVar12 = *(uint *)(p->Nodes + piVar16[uVar15 - 1]) >> 0xf;
            local_d8[uVar15] = uVar12 | 1;
            local_88[0] = *(uint *)pIVar14 >> 0xf | 1;
            local_88[1] = uVar12 & 0xfffffffe;
            iVar11 = sat_solver_addclause(pSat,(lit *)local_88,(lit *)(local_88 + 2));
            if (iVar11 == 0) {
              return 0;
            }
            uVar7 = uVar15 + 1;
            bVar21 = uVar15 != uVar19;
            uVar15 = uVar7;
          } while (bVar21);
        }
        iVar11 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)(local_d8 + uVar7));
        if (iVar11 == 0) {
          return 0;
        }
        break;
      case 4:
        uVar12 = 2 << (sbyte)uVar18;
        if (0 < (int)uVar12) {
          local_a0 = local_d8 + uVar19 + 1;
          uVar13 = 0;
          uVar30 = uVar9 & 0x1f | 0x80000000;
          uVar31 = uVar9 & 0x1f | 0x80000000;
          uVar32 = uVar18 | 0x80000000;
          uVar33 = uVar18 | 0x80000000;
          uVar7 = uVar19;
          local_48 = uVar30;
          uStack_44 = uVar31;
          uStack_40 = uVar32;
          uStack_3c = uVar33;
          do {
            auVar27 = (undefined1  [16])0x0;
            auVar24 = _DAT_0095b0f0;
            iVar11 = (uVar18 - (uVar9 & 3)) + 4;
            do {
              auVar22 = auVar24;
              auVar23 = auVar27;
              auVar24 = pshuflw(auVar23,auVar22,0xfe);
              auVar26 = pshuflw(in_XMM6,auVar22,0x54);
              auVar25._0_8_ = auVar22._8_8_;
              auVar25._8_4_ = auVar22._8_4_;
              auVar25._12_4_ = auVar22._12_4_;
              auVar27 = pshuflw(auVar26,auVar25,0xfe);
              auVar1._4_4_ = uVar13;
              auVar1._0_4_ = uVar13;
              auVar1._8_4_ = uVar13;
              auVar1._12_4_ = uVar13;
              lVar17 = auVar27._0_8_;
              auVar3._4_8_ = auVar1._8_8_;
              auVar3._0_4_ = uVar13 >> lVar17;
              auVar29._0_8_ = auVar3._0_8_ << 0x20;
              auVar29._8_4_ = uVar13 >> lVar17;
              auVar29._12_4_ = uVar13 >> lVar17;
              auVar27 = pshuflw(auVar25,auVar25,0x54);
              auVar2._4_4_ = uVar13;
              auVar2._0_4_ = uVar13;
              auVar2._8_4_ = uVar13;
              auVar2._12_4_ = uVar13;
              lVar17 = auVar27._0_8_;
              auVar4._4_8_ = auVar2._8_8_;
              auVar4._0_4_ = uVar13 >> lVar17;
              auVar28._0_8_ = auVar4._0_8_ << 0x20;
              auVar28._8_4_ = uVar13 >> lVar17;
              auVar28._12_4_ = uVar13 >> lVar17;
              in_XMM6._8_8_ = auVar29._8_8_;
              in_XMM6._0_8_ = auVar28._8_8_;
              auVar27._0_4_ = (uVar13 >> auVar26._0_8_) + auVar23._0_4_;
              auVar27._4_4_ = (uVar13 >> auVar24._0_8_) + auVar23._4_4_;
              auVar27._8_4_ = auVar28._8_4_ + auVar23._8_4_;
              auVar27._12_4_ = auVar29._12_4_ + auVar23._12_4_;
              auVar24._0_4_ = auVar22._0_4_ + 4;
              auVar24._4_4_ = auVar22._4_4_ + 4;
              auVar24._8_4_ = auVar22._8_4_ + 4;
              auVar24._12_4_ = auVar22._12_4_ + 4;
              iVar11 = iVar11 + -4;
            } while (iVar11 != 0);
            auVar22 = auVar22 ^ _DAT_0094e250;
            auVar26._0_4_ = -(uint)((int)uVar30 < auVar22._0_4_);
            auVar26._4_4_ = -(uint)((int)uVar31 < auVar22._4_4_);
            auVar26._8_4_ = -(uint)((int)uVar32 < auVar22._8_4_);
            auVar26._12_4_ = -(uint)((int)uVar33 < auVar22._12_4_);
            auVar27 = ~auVar26 & auVar27 | auVar23 & auVar26;
            if ((auVar27._12_4_ + auVar27._4_4_ + auVar27._8_4_ + auVar27._0_4_ & 1U) != 0) {
              local_d8[0] = (uint)((uVar13 >> ((uint)uVar7 & 0x1f) & 1) != 0) +
                            (uint)*(ushort *)&pIVar14->field_0x2 * 2;
              if ((uint)uVar7 != 0) {
                uVar7 = 0;
                do {
                  local_d8[uVar7 + 1] =
                       (uint)((uVar13 >> ((uint)uVar7 & 0x1f) & 1) != 0) +
                       (uint)*(ushort *)&p->Nodes[piVar16[uVar7]].field_0x2 * 2;
                  uVar7 = uVar7 + 1;
                } while (uVar19 != uVar7);
              }
              iVar11 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)local_a0);
              uVar7 = local_90;
              uVar30 = local_48;
              uVar31 = uStack_44;
              uVar32 = uStack_40;
              uVar33 = uStack_3c;
              if (iVar11 == 0) {
                return 0;
              }
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar12);
        }
        break;
      case 5:
        local_d8[0] = uVar12 >> 0xf & 0xfffffffe;
        local_d8[1] = *(uint *)(p->Nodes + pIVar14->Fanins[0]) >> 0xf | 1;
        local_d8[2] = *(uint *)(p->Nodes + pIVar14->Fanins[1]) >> 0xf | 1;
        iVar11 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)end);
        if (iVar11 == 0) {
          return 0;
        }
        local_d8[0] = *(uint *)pIVar14 >> 0xf | 1;
        local_d8[1] = *(uint *)(p->Nodes + pIVar14->Fanins[0]) >> 0xf | 1;
        local_d8[2] = (uint)*(ushort *)&p->Nodes[pIVar14->Fanins[1]].field_0x2 * 2;
        iVar11 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)end);
        if (iVar11 == 0) {
          return 0;
        }
        local_d8[0] = (uint)*(ushort *)&pIVar14->field_0x2 * 2;
        local_d8[1] = (uint)*(ushort *)&p->Nodes[pIVar14->Fanins[0]].field_0x2 * 2;
        local_d8[2] = *(uint *)(p->Nodes + pIVar14->Fanins[2]) >> 0xf | 1;
        iVar11 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)end);
        if (iVar11 == 0) {
          return 0;
        }
        local_d8[0] = *(uint *)pIVar14 >> 0xf | 1;
        local_d8[1] = (uint)*(ushort *)&p->Nodes[pIVar14->Fanins[0]].field_0x2 * 2;
        local_d8[2] = (uint)*(ushort *)&p->Nodes[pIVar14->Fanins[2]].field_0x2 * 2;
        iVar11 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)end);
        if (iVar11 == 0) {
          return 0;
        }
        break;
      case 6:
        if (uVar18 != 0x1f) {
          local_a0 = (uint *)(ulong)(uVar12 >> 8 & 0xff);
          uVar12 = 0;
          do {
            iVar11 = pValues[local_98];
            bVar21 = iVar11 == -1;
            if (bVar21) {
              local_d8[0] = *(uint *)pIVar14 >> 0xf & 0xfffffffe;
              local_88[0] = *(uint *)pIVar14 >> 0xf | 1;
            }
            uVar9 = (uint)bVar21;
            if ((int)local_90 != 0) {
              uVar7 = 0;
              do {
                uVar9 = (uint)((uVar12 >> ((uint)uVar7 & 0x1f) & 1) != 0) +
                        (uint)*(ushort *)&p->Nodes[piVar16[uVar7]].field_0x2 * 2;
                local_88[bVar21 + uVar7] = uVar9;
                local_d8[bVar21 + uVar7] = uVar9;
                uVar7 = uVar7 + 1;
              } while (uVar19 != uVar7);
              uVar9 = (uint)bVar21 + (int)uVar7;
            }
            iVar5 = (int)local_a0 + uVar12;
            local_d8[uVar9] = iVar5 * 2 + 1;
            local_88[uVar9] = iVar5 * 2;
            if (iVar11 == 0) {
LAB_00444832:
              iVar11 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)(local_d8 + (uVar9 + 1)));
              if (iVar11 == 0) {
                return 0;
              }
            }
            else {
              iVar11 = sat_solver_addclause(pSat,(lit *)local_88,(lit *)(local_88 + (uVar9 + 1)));
              if (iVar11 == 0) {
                return 0;
              }
              if (pValues[local_98] != 1) goto LAB_00444832;
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != 1 << (sbyte)uVar18);
        }
      }
      lVar17 = local_98 + 1;
      iVar11 = p->nObjs;
      piVar16 = piVar16 + 0xc;
    } while (lVar17 < iVar11);
  }
  local_d8[0] = (uint)(pValues[(long)iVar11 + -1] == 0) +
                (uint)*(ushort *)&p->Nodes[(long)iVar11 + -1].field_0x2 * 2;
  iVar11 = sat_solver_addclause(pSat,(lit *)local_d8,(lit *)(local_d8 + 1));
  return (uint)(iVar11 != 0);
}

Assistant:

int Ifn_NtkAddClauses( Ifn_Ntk_t * p, int * pValues, sat_solver * pSat )
{
    int i, f, v, nLits, pLits[IFN_INS+2], pLits2[IFN_INS+2];
    // assign new variables
    int nSatVars = sat_solver_nvars(pSat);
//    for ( i = 0; i < p->nObjs-1; i++ )
    for ( i = 0; i < p->nObjs; i++ )
        p->Nodes[i].Var = nSatVars++;
    //p->Nodes[p->nObjs-1].Var = 0xFFFF;
    sat_solver_setnvars( pSat, nSatVars );
    // verify variable values
    for ( i = 0; i < p->nVars; i++ )
        assert( pValues[i] != -1 );
    for ( i = p->nVars; i < p->nObjs-1; i++ )
        assert( pValues[i] == -1 );
    assert( pValues[p->nObjs-1] != -1 );
    // internal variables
//printf( "\n" );
    for ( i = 0; i < p->nInps; i++ )
    {
        int iParStart = p->nParsVIni + i * p->nParsVNum;
        for ( v = 0; v < p->nVars; v++ )
        {
            // add output literal
            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, pValues[v]==0 );
            // add clause literals
            for ( f = 0; f < p->nParsVNum; f++ )
                pLits[f+1] = Abc_Var2Lit( iParStart + f, (v >> f) & 1 ); 
            if ( !Ifn_AddClause( pSat, pLits, pLits+p->nParsVNum+1 ) )
                return 0;
        }
    }
//printf( "\n" );
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        int nFans = p->Nodes[i].nFanins;
        int * pFans = p->Nodes[i].Fanins;
        if ( p->Nodes[i].Type == IFN_DSD_AND )
        {
            nLits = 0;
            pLits[nLits++] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            for ( f = 0; f < nFans; f++ )
            {
                pLits[nLits++] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, 1 );
                // add small clause
                pLits2[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
                pLits2[1] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, 0 );
                if ( !Ifn_AddClause( pSat, pLits2, pLits2 + 2 ) )
                    return 0;
            }
            // add big clause
            if ( !Ifn_AddClause( pSat, pLits, pLits + nLits ) )
                return 0;
        }
        else if ( p->Nodes[i].Type == IFN_DSD_XOR )
        {
            int m, nMints = (1 << (nFans+1));
            for ( m = 0; m < nMints; m++ )
            {
                // skip even 
                int Count = 0;
                for ( v = 0; v <= nFans; v++ )
                    Count += ((m >> v) & 1);
                if ( (Count & 1) == 0 )
                    continue;
                // generate minterm
                pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, (m >> nFans) & 1 );
                for ( v = 0; v < nFans; v++ )
                    pLits[v+1] = Abc_Var2Lit( p->Nodes[pFans[v]].Var, (m >> v) & 1 );
                if ( !Ifn_AddClause( pSat, pLits, pLits + nFans + 1 ) )
                    return 0;
            }
        }
        else if ( p->Nodes[i].Type == IFN_DSD_MUX )
        {
            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 1 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[1]].Var, 1 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 1 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[1]].Var, 0 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 0 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 0 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[2]].Var, 1 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;

            pLits[0] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
            pLits[1] = Abc_Var2Lit( p->Nodes[pFans[0]].Var, 0 ); // ctrl
            pLits[2] = Abc_Var2Lit( p->Nodes[pFans[2]].Var, 0 );
            if ( !Ifn_AddClause( pSat, pLits, pLits + 3 ) )
                return 0;
        }
        else if ( p->Nodes[i].Type == IFN_DSD_PRIME )
        {
            int nValues = (1 << nFans);
            int iParStart = p->Nodes[i].iFirst;
            for ( v = 0; v < nValues; v++ )
            {
                nLits = 0;
                if ( pValues[i] == -1 )
                {
                    pLits[nLits]  = Abc_Var2Lit( p->Nodes[i].Var, 0 );
                    pLits2[nLits] = Abc_Var2Lit( p->Nodes[i].Var, 1 );
                    nLits++;
                }
                for ( f = 0; f < nFans; f++, nLits++ )
                    pLits[nLits] = pLits2[nLits] = Abc_Var2Lit( p->Nodes[pFans[f]].Var, (v >> f) & 1 ); 
                pLits[nLits]  = Abc_Var2Lit( iParStart + v, 1 ); 
                pLits2[nLits] = Abc_Var2Lit( iParStart + v, 0 ); 
                nLits++;
                if ( pValues[i] != 0 )
                {
                    if ( !Ifn_AddClause( pSat, pLits2, pLits2 + nLits ) )
                        return 0;
                }
                if ( pValues[i] != 1 )
                {
                    if ( !Ifn_AddClause( pSat, pLits,  pLits + nLits ) )
                        return 0;
                }
            }
        }
        else assert( 0 );
//printf( "\n" );
    }
    // add last clause (not needed if the root node is IFN_DSD_PRIME)
    pLits[0] = Abc_Var2Lit( p->Nodes[p->nObjs-1].Var, pValues[p->nObjs-1]==0 );
    if ( !Ifn_AddClause( pSat, pLits,  pLits + 1 ) )
        return 0;
    return 1;
}